

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O0

void wallet::wallet_crypto_tests::TestCrypter::TestEncrypt
               (CCrypter *crypt,span<const_unsigned_char,_18446744073709551615UL> plaintext,
               span<const_unsigned_char,_18446744073709551615UL> correct_ciphertext)

{
  bool bVar1;
  iterator __first;
  iterator iVar2;
  span<const_unsigned_char,_18446744073709551615UL> *in_RDI;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> in_stack_00000030;
  iterator it;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffef8;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_ffffffffffffff00;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_ffffffffffffff08;
  span<const_unsigned_char,_18446744073709551615UL> *__a;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> *this;
  __normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
  in_stack_ffffffffffffff40;
  CKeyingMaterial *in_stack_ffffffffffffff78;
  iterator plaintext_00;
  CCrypter *in_stack_ffffffffffffff80;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> local_40 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __a = in_RDI;
  std::span<const_unsigned_char,_18446744073709551615UL>::begin(in_stack_ffffffffffffff00);
  __first = std::span<const_unsigned_char,_18446744073709551615UL>::end(in_stack_ffffffffffffff08);
  this = local_40;
  std::vector<unsigned_char,secure_allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::span<unsigned_char_const,18446744073709551615ul>>,void>
            (this,(__normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
                   )__first._M_current,in_stack_ffffffffffffff40,(allocator_type *)__a);
  TestEncryptSingle(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_00000030);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_ffffffffffffff08);
  iVar2 = std::span<const_unsigned_char,_18446744073709551615UL>::begin(in_stack_ffffffffffffff00);
  while( true ) {
    std::span<const_unsigned_char,_18446744073709551615UL>::end(in_stack_ffffffffffffff08);
    bVar1 = __gnu_cxx::
            operator==<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
                      ((__normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff08,
                       (__normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff08 = in_RDI;
    plaintext_00 = iVar2;
    std::span<const_unsigned_char,_18446744073709551615UL>::end(in_RDI);
    std::vector<unsigned_char,secure_allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::span<unsigned_char_const,18446744073709551615ul>>,void>
              (this,(__normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
                     )__first._M_current,in_stack_ffffffffffffff40,(allocator_type *)__a);
    std::span<const_unsigned_char,_18446744073709551615UL>::span(in_stack_fffffffffffffef8);
    TestEncryptSingle(in_stack_ffffffffffffff80,(CKeyingMaterial *)plaintext_00._M_current,
                      in_stack_00000030);
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_ffffffffffffff08)
    ;
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
                  *)in_stack_fffffffffffffef8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestEncrypt(const CCrypter& crypt, const std::span<const unsigned char> plaintext,
                        const std::span<const unsigned char> correct_ciphertext = {})
{
    TestEncryptSingle(crypt, CKeyingMaterial{plaintext.begin(), plaintext.end()}, correct_ciphertext);
    for (auto it{plaintext.begin()}; it != plaintext.end(); ++it) {
        TestEncryptSingle(crypt, CKeyingMaterial{it, plaintext.end()});
    }
}